

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

bool google::SendEmailInternal(char *dest,char *subject,char *body,bool use_logging)

{
  FILE *pFVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  istream *piVar5;
  char *__s;
  ulong uVar6;
  char *__command;
  size_t __n;
  ostream *poVar7;
  uint *puVar8;
  undefined8 uVar9;
  int err;
  int err_00;
  bool local_82a;
  bool local_7d3;
  bool local_7b5;
  LogMessage local_798;
  string local_738;
  string local_718;
  LogMessage local_6f8;
  byte local_691;
  FILE *pFStack_690;
  bool ok;
  FILE *pipe;
  LogMessage local_680;
  LogMessageVoidify local_61a;
  bool local_619;
  undefined4 local_618;
  allocator<char> local_611;
  int32 verbose_level___2;
  string local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  string local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  undefined1 local_528 [8];
  string cmd;
  undefined1 local_4e8 [8];
  string logmailer;
  LogMessage local_4c0;
  LogMessageVoidify local_45e;
  bool local_45d;
  undefined4 local_45c;
  string local_458 [4];
  int32 verbose_level___1;
  string *local_438;
  string *tmp;
  int local_410;
  byte local_409;
  LogMessage local_408;
  LogMessageVoidify local_3a6;
  bool local_3a5;
  undefined4 local_3a4;
  undefined1 local_3a0 [4];
  int32 verbose_level__;
  undefined1 local_380 [8];
  string s;
  ostringstream sanitized_dests;
  allocator<char> local_1d1;
  string local_1d0 [32];
  istringstream local_1b0 [8];
  istringstream ss;
  bool use_logging_local;
  char *body_local;
  char *subject_local;
  char *dest_local;
  
  if ((dest != (char *)0x0) && (*dest != '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1d0,dest,&local_1d1);
    std::__cxx11::istringstream::istringstream(local_1b0,local_1d0,8);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(s.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_380);
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1b0,(string *)local_380,',');
      bVar2 = std::ios::operator_cast_to_bool(piVar5 + *(long *)(*(long *)piVar5 + -0x18));
      if (!bVar2) break;
      trim((string *)local_380);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_3a0,
                   "^[a-zA-Z0-9][a-zA-Z0-9.!#$%&\'*+/=?^_`{|}~-]*@[a-zA-Z0-9](?:[a-zA-Z0-9-]{0,61}[a-zA-Z0-9])?(?:\\.[a-zA-Z0-9](?:[a-zA-Z0-9-]{0,61}[a-zA-Z0-9])?)*$"
                   ,0x10);
        bVar2 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_380,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_3a0,0);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_3a0);
        pFVar1 = _stderr;
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          if (use_logging) {
            local_3a4 = 1;
            local_409 = 0;
            if (SendEmailInternal::vlocal__.level == (int32 *)0x0) {
              local_7b5 = InitVLOG3__(&SendEmailInternal::vlocal__,&fLI::FLAGS_v,
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                                      ,1);
            }
            else {
              local_7b5 = 0 < *SendEmailInternal::vlocal__.level;
            }
            local_3a5 = local_7b5;
            if (local_7b5 != false) {
              LogMessageVoidify::LogMessageVoidify(&local_3a6);
              LogMessage::LogMessage
                        (&local_408,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                         ,0x88e);
              local_409 = 1;
              poVar7 = LogMessage::stream(&local_408);
              poVar7 = std::operator<<(poVar7,"Invalid destination email address:");
              poVar7 = std::operator<<(poVar7,(string *)local_380);
              LogMessageVoidify::operator&(&local_3a6,poVar7);
            }
            if ((local_409 & 1) != 0) {
              LogMessage::~LogMessage(&local_408);
            }
          }
          else {
            uVar9 = std::__cxx11::string::c_str();
            fprintf(pFVar1,"Invalid destination email address: %s\n",uVar9);
          }
          dest_local._7_1_ = 0;
          local_410 = 1;
          goto LAB_00110bb8;
        }
        std::__cxx11::ostringstream::str();
        bVar3 = std::__cxx11::string::empty();
        std::__cxx11::string::~string((string *)&tmp);
        if (((bVar3 ^ 0xff) & 1) != 0) {
          std::operator<<((ostream *)((long)&s.field_2 + 8),",");
        }
        std::operator<<((ostream *)((long)&s.field_2 + 8),(string *)local_380);
      }
    }
    std::__cxx11::ostringstream::str();
    local_438 = local_458;
    __s = (char *)std::__cxx11::string::c_str();
    if (use_logging) {
      local_45c = 1;
      logmailer.field_2._M_local_buf[0xf] = '\0';
      if (SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level ==
          (int32 *)0x0) {
        local_7d3 = InitVLOG3__(&SendEmailInternal(char_const*,char_const*,char_const*,bool)::
                                 vlocal__,&fLI::FLAGS_v,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                                ,1);
      }
      else {
        local_7d3 = 0 < *SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level
        ;
      }
      local_45d = local_7d3;
      if (local_7d3 != false) {
        LogMessageVoidify::LogMessageVoidify(&local_45e);
        LogMessage::LogMessage
                  (&local_4c0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                   ,0x89e);
        logmailer.field_2._M_local_buf[0xf] = '\x01';
        poVar7 = LogMessage::stream(&local_4c0);
        poVar7 = std::operator<<(poVar7,"Trying to send TITLE:");
        poVar7 = std::operator<<(poVar7,subject);
        poVar7 = std::operator<<(poVar7," BODY:");
        poVar7 = std::operator<<(poVar7,body);
        poVar7 = std::operator<<(poVar7," to ");
        poVar7 = std::operator<<(poVar7,__s);
        LogMessageVoidify::operator&(&local_45e,poVar7);
      }
      if ((logmailer.field_2._M_local_buf[0xf] & 1U) != 0) {
        LogMessage::~LogMessage(&local_4c0);
      }
    }
    else {
      fprintf(_stderr,"Trying to send TITLE: %s BODY: %s to %s\n",subject,body,__s);
    }
    std::__cxx11::string::string((string *)local_4e8);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      ShellEscape((string *)((long)&cmd.field_2 + 8),(string *)fLS::FLAGS_logmailer_buf_abi_cxx11_);
      std::__cxx11::string::operator=((string *)local_4e8,(string *)(cmd.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(cmd.field_2._M_local_buf + 8));
    }
    else {
      std::__cxx11::string::operator=((string *)local_4e8,"/bin/mail");
    }
    std::operator+(&local_588,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8,
                   " -s");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,subject,&local_5c9);
    ShellEscape(&local_5a8,&local_5c8);
    std::operator+(&local_568,&local_588,&local_5a8);
    std::operator+(&local_548,&local_568," ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&verbose_level___2,__s,&local_611);
    ShellEscape(&local_5f0,(string *)&verbose_level___2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528,
                   &local_548,&local_5f0);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::__cxx11::string::~string((string *)&verbose_level___2);
    std::allocator<char>::~allocator(&local_611);
    std::__cxx11::string::~string((string *)&local_548);
    std::__cxx11::string::~string((string *)&local_568);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::allocator<char>::~allocator(&local_5c9);
    std::__cxx11::string::~string((string *)&local_588);
    if (use_logging) {
      local_618 = 4;
      pipe._7_1_ = 0;
      if (SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level ==
          (int32 *)0x0) {
        local_82a = InitVLOG3__(&SendEmailInternal(char_const*,char_const*,char_const*,bool)::
                                 vlocal__,&fLI::FLAGS_v,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                                ,4);
      }
      else {
        local_82a = 3 < *SendEmailInternal(char_const*,char_const*,char_const*,bool)::vlocal__.level
        ;
      }
      local_619 = local_82a;
      if (local_82a != false) {
        LogMessageVoidify::LogMessageVoidify(&local_61a);
        LogMessage::LogMessage
                  (&local_680,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                   ,0x8b1);
        pipe._7_1_ = 1;
        poVar7 = LogMessage::stream(&local_680);
        poVar7 = std::operator<<(poVar7,"Mailing command: ");
        poVar7 = std::operator<<(poVar7,(string *)local_528);
        LogMessageVoidify::operator&(&local_61a,poVar7);
      }
      if ((pipe._7_1_ & 1) != 0) {
        LogMessage::~LogMessage(&local_680);
      }
    }
    __command = (char *)std::__cxx11::string::c_str();
    pFStack_690 = popen(__command,"w");
    if (pFStack_690 == (FILE *)0x0) {
      if (use_logging) {
        LogMessage::LogMessage
                  (&local_798,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                   ,0x8c7,ERROR);
        poVar7 = LogMessage::stream(&local_798);
        poVar7 = std::operator<<(poVar7,"Unable to send mail to ");
        std::operator<<(poVar7,__s);
        LogMessage::~LogMessage(&local_798);
      }
      else {
        fprintf(_stderr,"Unable to send mail to %s\n",__s);
      }
      local_410 = 0;
    }
    else {
      if (body != (char *)0x0) {
        __n = strlen(body);
        fwrite(body,1,__n,pFStack_690);
      }
      iVar4 = pclose(pFStack_690);
      pFVar1 = _stderr;
      local_691 = iVar4 != -1;
      if (!(bool)local_691) {
        if (use_logging) {
          LogMessage::LogMessage
                    (&local_6f8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                     ,0x8bd,ERROR);
          poVar7 = LogMessage::stream(&local_6f8);
          poVar7 = std::operator<<(poVar7,"Problems sending mail to ");
          poVar7 = std::operator<<(poVar7,__s);
          poVar7 = std::operator<<(poVar7,": ");
          puVar8 = (uint *)__errno_location();
          StrError_abi_cxx11_(&local_718,(google *)(ulong)*puVar8,err);
          std::operator<<(poVar7,(string *)&local_718);
          std::__cxx11::string::~string((string *)&local_718);
          LogMessage::~LogMessage(&local_6f8);
        }
        else {
          puVar8 = (uint *)__errno_location();
          StrError_abi_cxx11_(&local_738,(google *)(ulong)*puVar8,err_00);
          uVar9 = std::__cxx11::string::c_str();
          fprintf(pFVar1,"Problems sending mail to %s: %s\n",__s,uVar9);
          std::__cxx11::string::~string((string *)&local_738);
        }
      }
      dest_local._7_1_ = local_691 & 1;
      local_410 = 1;
    }
    std::__cxx11::string::~string((string *)local_528);
    std::__cxx11::string::~string((string *)local_4e8);
    std::__cxx11::string::~string(local_458);
LAB_00110bb8:
    std::__cxx11::string::~string((string *)local_380);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(s.field_2._M_local_buf + 8));
    std::__cxx11::istringstream::~istringstream(local_1b0);
    if (local_410 != 0) goto LAB_00110c3a;
  }
  dest_local._7_1_ = 0;
LAB_00110c3a:
  return (bool)(dest_local._7_1_ & 1);
}

Assistant:

static bool SendEmailInternal(const char* dest, const char* subject,
                              const char* body, bool use_logging) {
#ifndef GLOG_OS_EMSCRIPTEN
  if (dest && *dest) {
    // Split the comma-separated list of email addresses, validate each one and
    // build a sanitized new comma-separated string without whitespace.
    std::istringstream ss(dest);
    std::ostringstream sanitized_dests;
    std::string s;
    while (std::getline(ss, s, ',')) {
      trim(s);
      if (s.empty()) {
        continue;
      }
      // We validate the provided email addresses using the same regular
      // expression that HTML5 uses[1], except that we require the address to
      // start with an alpha-numeric character. This is because we don't want to
      // allow email addresses that start with a special character, such as a
      // pipe or dash, which could be misunderstood as a command-line flag by
      // certain versions of `mail` that are vulnerable to command injection.[2]
      // [1]
      // https://html.spec.whatwg.org/multipage/input.html#valid-e-mail-address
      // [2] e.g. https://nvd.nist.gov/vuln/detail/CVE-2004-2771
      if (!std::regex_match(
              s,
              std::regex("^[a-zA-Z0-9]"
                         "[a-zA-Z0-9.!#$%&'*+/=?^_`{|}~-]*@[a-zA-Z0-9]"
                         "(?:[a-zA-Z0-9-]{0,61}[a-zA-Z0-9])?(?:\\.[a-zA-Z0-9]"
                         "(?:[a-zA-Z0-9-]{0,61}[a-zA-Z0-9])?)*$"))) {
        if (use_logging) {
          VLOG(1) << "Invalid destination email address:" << s;
        } else {
          fprintf(stderr, "Invalid destination email address: %s\n", s.c_str());
        }
        return false;
      }
      if (!sanitized_dests.str().empty()) {
        sanitized_dests << ",";
      }
      sanitized_dests << s;
    }
    // Avoid dangling reference
    const std::string& tmp = sanitized_dests.str();
    dest = tmp.c_str();

    if (use_logging) {
      VLOG(1) << "Trying to send TITLE:" << subject << " BODY:" << body
              << " to " << dest;
    } else {
      fprintf(stderr, "Trying to send TITLE: %s BODY: %s to %s\n", subject,
              body, dest);
    }

    string logmailer;

    if (FLAGS_logmailer.empty()) {
      // Don't need to shell escape the literal string
      logmailer = "/bin/mail";
    } else {
      logmailer = ShellEscape(FLAGS_logmailer);
    }

    string cmd =
        logmailer + " -s" + ShellEscape(subject) + " " + ShellEscape(dest);
    if (use_logging) {
      VLOG(4) << "Mailing command: " << cmd;
    }

    FILE* pipe = popen(cmd.c_str(), "w");
    if (pipe != nullptr) {
      // Add the body if we have one
      if (body) {
        fwrite(body, sizeof(char), strlen(body), pipe);
      }
      bool ok = pclose(pipe) != -1;
      if (!ok) {
        if (use_logging) {
          LOG(ERROR) << "Problems sending mail to " << dest << ": "
                     << StrError(errno);
        } else {
          fprintf(stderr, "Problems sending mail to %s: %s\n", dest,
                  StrError(errno).c_str());
        }
      }
      return ok;
    } else {
      if (use_logging) {
        LOG(ERROR) << "Unable to send mail to " << dest;
      } else {
        fprintf(stderr, "Unable to send mail to %s\n", dest);
      }
    }
  }
#else
  (void)dest;
  (void)subject;
  (void)body;
  (void)use_logging;
  LOG(WARNING) << "Email support not available; not sending message";
#endif
  return false;
}